

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

int Bmc_GiaGenerateJust_rec(Gia_Man_t *p,int iFrame,int iObj,Vec_Bit_t *vValues,Vec_Bit_t *vJustis)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  
  if (iFrame < 0) {
    return 0;
  }
LAB_0057c2b2:
  iVar9 = p->nObjs * iFrame;
  do {
    uVar10 = iVar9 + iObj;
    if (((int)uVar10 < 0) || (vJustis->nSize <= (int)uVar10)) goto LAB_0057c46e;
    uVar7 = uVar10 >> 5;
    uVar4 = vJustis->pArray[uVar7];
    uVar8 = 1 << ((byte)uVar10 & 0x1f);
    if ((uVar4 >> (uVar10 & 0x1f) & 1) != 0) {
      return 0;
    }
    vJustis->pArray[uVar7] = uVar4 | uVar8;
    if ((iObj < 0) || (uVar4 = p->nObjs, (int)uVar4 <= iObj)) {
LAB_0057c48d:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar6 = *(ulong *)(p->pObjs + (uint)iObj);
    uVar5 = (uint)uVar6;
    if ((uVar6 & 0x1fffffff) != 0x1fffffff && (int)uVar5 < 0) goto LAB_0057c450;
    if ((~uVar5 & 0x9fffffff) != 0) break;
    uVar10 = (uint)(uVar6 >> 0x20) & 0x1fffffff;
    iVar9 = p->vCis->nSize;
    if ((int)uVar10 < iVar9 - p->nRegs) {
      __assert_fail("Gia_ObjIsRo(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = p->vCos->nSize;
    uVar10 = (iVar2 - iVar9) + uVar10;
    if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iObj = p->vCos->pArray[uVar10];
    if ((iObj < 0) || (uVar4 <= (uint)iObj)) goto LAB_0057c48d;
    iVar9 = uVar4 * (iFrame + -1);
    bVar3 = iFrame < 1;
    iFrame = iFrame + -1;
    if (bVar3) {
      return 0;
    }
  } while( true );
  if (((int)uVar5 < 0) || ((int)(uVar6 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                  ,0x3d,
                  "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)");
  }
  if (vValues->nSize <= (int)uVar10) {
LAB_0057c46e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
  }
  pGVar1 = p->pObjs + (uint)iObj;
  if ((vValues->pArray[uVar7] & uVar8) == 0) {
    uVar4 = Vec_BitEntry(vValues,uVar10 - (uVar5 & 0x1fffffff));
    uVar6 = *(ulong *)pGVar1;
    if (uVar4 != (((uint)uVar6 >> 0x1d & 1) != 0)) {
      uVar10 = Vec_BitEntry(vValues,uVar10 - ((uint)(uVar6 >> 0x20) & 0x1fffffff));
      if (uVar10 != ((*(ulong *)pGVar1 >> 0x3d & 1) != 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0x47,
                      "int Bmc_GiaGenerateJust_rec(Gia_Man_t *, int, int, Vec_Bit_t *, Vec_Bit_t *)"
                     );
      }
      uVar6 = *(ulong *)pGVar1 >> 0x20;
    }
  }
  else {
    Bmc_GiaGenerateJust_rec(p,iFrame,iObj - (uVar5 & 0x1fffffff),vValues,vJustis);
    uVar6 = (ulong)*(uint *)&pGVar1->field_0x4;
  }
LAB_0057c450:
  iObj = iObj - ((uint)uVar6 & 0x1fffffff);
  goto LAB_0057c2b2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generate justifying assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_GiaGenerateJust_rec( Gia_Man_t * p, int iFrame, int iObj, Vec_Bit_t * vValues, Vec_Bit_t * vJustis )
{
    Gia_Obj_t * pObj;
    int Shift = Gia_ManObjNum(p) * iFrame;
    if ( iFrame < 0 )
        return 0;
    assert( iFrame >= 0 );
    if ( Vec_BitEntry( vJustis, Shift + iObj ) )
        return 0;
    Vec_BitWriteEntry( vJustis, Shift + iObj, 1 );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCo(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    if ( Gia_ObjIsCi(pObj) )
        return Bmc_GiaGenerateJust_rec( p, iFrame-1, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)), vValues, vJustis );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Vec_BitEntry( vValues, Shift + iObj ) )
    {
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    }
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId0(pObj, iObj) ) == Gia_ObjFaninC0(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId0(pObj, iObj), vValues, vJustis );
    else if ( Vec_BitEntry( vValues, Shift + Gia_ObjFaninId1(pObj, iObj) ) == Gia_ObjFaninC1(pObj) )
        Bmc_GiaGenerateJust_rec( p, iFrame, Gia_ObjFaninId1(pObj, iObj), vValues, vJustis );
    else assert( 0 );
    return 0;
}